

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

char * stbi__hdr_gettoken(stbi__context *z,char *buffer)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  int iVar3;
  int iVar4;
  char *in_RSI;
  char c;
  int len;
  byte in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffe9;
  undefined1 in_stack_ffffffffffffffea;
  int iVar5;
  
  iVar5 = 0;
  sVar1 = stbi__get8((stbi__context *)
                     (ulong)CONCAT12(in_stack_ffffffffffffffea,
                                     CONCAT11(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8)))
  ;
  while( true ) {
    iVar3 = stbi__at_eof((stbi__context *)
                         CONCAT44(iVar5,CONCAT13(sVar1,CONCAT12(in_stack_ffffffffffffffea,
                                                                CONCAT11(in_stack_ffffffffffffffe9,
                                                                         in_stack_ffffffffffffffe8))
                                                )));
    in_stack_ffffffffffffffea = iVar3 == 0 && sVar1 != '\n';
    iVar4 = iVar5;
    if (iVar3 != 0 || sVar1 == '\n') break;
    iVar4 = iVar5 + 1;
    in_RSI[iVar5] = sVar1;
    if (iVar4 == 0x3ff) goto LAB_0011bd91;
    sVar1 = stbi__get8((stbi__context *)
                       CONCAT44(iVar4,CONCAT13(sVar1,CONCAT12(in_stack_ffffffffffffffea,
                                                              CONCAT11(in_stack_ffffffffffffffe9,
                                                                       in_stack_ffffffffffffffe8))))
                      );
    iVar5 = iVar4;
  }
LAB_0011bde0:
  in_RSI[iVar4] = '\0';
  return in_RSI;
LAB_0011bd91:
  do {
    iVar5 = stbi__at_eof((stbi__context *)
                         CONCAT44(iVar4,CONCAT13(sVar1,CONCAT12(in_stack_ffffffffffffffea,
                                                                CONCAT11(in_stack_ffffffffffffffe9,
                                                                         in_stack_ffffffffffffffe8))
                                                )));
    in_stack_ffffffffffffffe9 = false;
    if (iVar5 == 0) {
      sVar2 = stbi__get8((stbi__context *)
                         CONCAT44(iVar4,CONCAT13(sVar1,CONCAT12(in_stack_ffffffffffffffea,
                                                                (ushort)in_stack_ffffffffffffffe8)))
                        );
      in_stack_ffffffffffffffe9 = sVar2 != '\n';
    }
  } while ((bool)in_stack_ffffffffffffffe9 != false);
  goto LAB_0011bde0;
}

Assistant:

static char *stbi__hdr_gettoken(stbi__context *z, char *buffer)
{
   int len=0;
   char c = '\0';

   c = (char) stbi__get8(z);

   while (!stbi__at_eof(z) && c != '\n') {
      buffer[len++] = c;
      if (len == STBI__HDR_BUFLEN-1) {
         // flush to end of line
         while (!stbi__at_eof(z) && stbi__get8(z) != '\n')
            ;
         break;
      }
      c = (char) stbi__get8(z);
   }

   buffer[len] = 0;
   return buffer;
}